

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O2

void av1_calculate_tile_cols
               (SequenceHeader *seq_params,int cm_mi_rows,int cm_mi_cols,CommonTileParams *tiles)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  
  bVar4 = (byte)seq_params->mib_size_log2;
  uVar11 = ~(-1 << (bVar4 & 0x1f));
  iVar10 = (int)(uVar11 + cm_mi_cols) >> (bVar4 & 0x1f);
  iVar12 = (int)(uVar11 + cm_mi_rows) >> (bVar4 & 0x1f);
  tiles->min_inner_width = -1;
  if (tiles->uniform_spacing == 0) {
    uVar11 = tiles->cols;
    iVar9 = 1;
    iVar7 = tile_log2(1,uVar11);
    tiles->log2_cols = iVar7;
    uVar3 = 0;
    if (0 < (int)uVar11) {
      uVar3 = (ulong)uVar11;
    }
    uVar6 = 0;
    iVar7 = 0x10000;
    while (uVar3 != uVar6) {
      iVar8 = tiles->col_start_sb[uVar6 + 1] - tiles->col_start_sb[uVar6];
      if (iVar9 <= iVar8) {
        iVar9 = iVar8;
      }
      if (iVar7 < iVar8) {
        iVar8 = iVar7;
      }
      uVar1 = uVar6 + 1;
      bVar2 = (long)uVar6 < (long)(int)uVar11 + -1;
      uVar6 = uVar1;
      if (bVar2) {
        iVar7 = iVar8;
      }
    }
    bVar5 = (char)tiles->min_log2 + 1;
    if (tiles->min_log2 == 0) {
      bVar5 = 0;
    }
    iVar9 = (iVar12 * iVar10 >> (bVar5 & 0x1f)) / iVar9;
    iVar10 = 1;
    if (1 < iVar9) {
      iVar10 = iVar9;
    }
    tiles->max_height_sb = iVar10;
    if ((int)uVar11 < 2) {
      return;
    }
    iVar7 = iVar7 << (bVar4 & 0x1f);
  }
  else {
    iVar9 = tiles->log2_cols;
    bVar5 = (byte)iVar9;
    bVar4 = bVar5 & 0x1f;
    iVar7 = (1 << bVar4) + iVar10 + -1 >> (bVar5 & 0x1f);
    uVar3 = (ulong)(uint)(0 << bVar4);
    for (iVar8 = 0; iVar8 < iVar10; iVar8 = iVar8 + iVar7) {
      tiles->col_start_sb[uVar3] = iVar8;
      uVar3 = uVar3 + 1;
    }
    tiles->cols = (int)uVar3;
    tiles->col_start_sb[uVar3 & 0xffffffff] = iVar10;
    iVar9 = tiles->min_log2 - iVar9;
    iVar10 = 0;
    if (0 < iVar9) {
      iVar10 = iVar9;
    }
    tiles->min_log2_rows = iVar10;
    tiles->max_height_sb = iVar12 >> ((byte)iVar10 & 0x1f);
    iVar7 = iVar7 << ((byte)seq_params->mib_size_log2 & 0x1f);
    if (cm_mi_cols <= iVar7) {
      iVar7 = cm_mi_cols;
    }
    tiles->width = iVar7;
    if (uVar3 < 2) {
      return;
    }
  }
  tiles->min_inner_width = iVar7;
  return;
}

Assistant:

void av1_calculate_tile_cols(const SequenceHeader *const seq_params,
                             int cm_mi_rows, int cm_mi_cols,
                             CommonTileParams *const tiles) {
  int sb_cols = CEIL_POWER_OF_TWO(cm_mi_cols, seq_params->mib_size_log2);
  int sb_rows = CEIL_POWER_OF_TWO(cm_mi_rows, seq_params->mib_size_log2);
  int i;

  // This will be overridden if there is at least two columns of tiles
  // (otherwise there is no inner tile width)
  tiles->min_inner_width = -1;

  if (tiles->uniform_spacing) {
    int start_sb;
    int size_sb = CEIL_POWER_OF_TWO(sb_cols, tiles->log2_cols);
    assert(size_sb > 0);
    for (i = 0, start_sb = 0; start_sb < sb_cols; i++) {
      tiles->col_start_sb[i] = start_sb;
      start_sb += size_sb;
    }
    tiles->cols = i;
    tiles->col_start_sb[i] = sb_cols;
    tiles->min_log2_rows = AOMMAX(tiles->min_log2 - tiles->log2_cols, 0);
    tiles->max_height_sb = sb_rows >> tiles->min_log2_rows;

    tiles->width = size_sb << seq_params->mib_size_log2;
    tiles->width = AOMMIN(tiles->width, cm_mi_cols);
    if (tiles->cols > 1) {
      tiles->min_inner_width = tiles->width;
    }
  } else {
    int max_tile_area_sb = (sb_rows * sb_cols);
    int widest_tile_sb = 1;
    int narrowest_inner_tile_sb = 65536;
    tiles->log2_cols = tile_log2(1, tiles->cols);
    for (i = 0; i < tiles->cols; i++) {
      int size_sb = tiles->col_start_sb[i + 1] - tiles->col_start_sb[i];
      widest_tile_sb = AOMMAX(widest_tile_sb, size_sb);
      // ignore the rightmost tile in frame for determining the narrowest
      if (i < tiles->cols - 1)
        narrowest_inner_tile_sb = AOMMIN(narrowest_inner_tile_sb, size_sb);
    }
    if (tiles->min_log2) {
      max_tile_area_sb >>= (tiles->min_log2 + 1);
    }
    tiles->max_height_sb = AOMMAX(max_tile_area_sb / widest_tile_sb, 1);
    if (tiles->cols > 1) {
      tiles->min_inner_width = narrowest_inner_tile_sb
                               << seq_params->mib_size_log2;
    }
  }
}